

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestUInt value)

{
  char **ppcVar1;
  allocator local_41;
  char **local_40;
  char *current;
  UIntToStringBuffer buffer;
  LargestUInt value_local;
  
  local_40 = (char **)(buffer + 0x11);
  unique0x100000b6 = this;
  uintToString((LargestUInt)this,(char **)&local_40);
  ppcVar1 = local_40;
  if (&current <= local_40) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)ppcVar1,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x58,"std::string Json::valueToString(LargestUInt)");
}

Assistant:

std::string valueToString(LargestUInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  uintToString(value, current);
  assert(current >= buffer);
  return current;
}